

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map,_func_void_void_ptr *freevalue)

{
  code *in_RSI;
  long *in_RDI;
  int i;
  int local_1c;
  
  if ((in_RDI != (long *)0x0) && (in_RSI != (code *)0x0)) {
    for (local_1c = 0; local_1c < *(int *)(*in_RDI + 4); local_1c = local_1c + 1) {
      if ((*(long *)(*(long *)(*in_RDI + 8) + (long)local_1c * 8) != 0) &&
         (*(long *)(*(long *)(*(long *)(*in_RDI + 8) + (long)local_1c * 8) + 8) != 0)) {
        (*in_RSI)(*(undefined8 *)(*(long *)(*(long *)(*in_RDI + 8) + (long)local_1c * 8) + 8));
      }
      if (*(long *)(*(long *)(*in_RDI + 8) + (long)local_1c * 8) != 0) {
        free(*(void **)(*(long *)(*in_RDI + 8) + (long)local_1c * 8));
      }
    }
    if (*(long *)(*in_RDI + 8) != 0) {
      free(*(void **)(*in_RDI + 8));
    }
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    *in_RDI = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map, void (*freevalue)(void* ptr))
{
  int i;

  if (map == NULL || freevalue == NULL) { return SUN_SUCCESS; }

  for (i = 0; i < (*map)->max_size; i++)
  {
    if ((*map)->buckets[i] && (*map)->buckets[i]->value)
    {
      freevalue((*map)->buckets[i]->value);
    }

    if ((*map)->buckets[i]) { free((*map)->buckets[i]); }
  }
  if ((*map)->buckets) { free((*map)->buckets); }
  if (*map) { free(*map); }
  *map = NULL;

  return SUN_SUCCESS;
}